

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O1

ir_rvalue * __thiscall
ast_compound_statement::hir
          (ast_compound_statement *this,exec_list *instructions,_mesa_glsl_parse_state *state)

{
  long *plVar1;
  exec_node *peVar2;
  exec_node **ppeVar3;
  
  if (this->new_scope != 0) {
    glsl_symbol_table::push_scope(state->symbols);
  }
  peVar2 = (this->statements).head_sentinel.next;
  ppeVar3 = &peVar2[-3].prev;
  if (ppeVar3 != (exec_node **)0x0 && peVar2->next != (exec_node *)0x0) {
    do {
      (*(code *)(*ppeVar3)->prev)(ppeVar3,instructions,state);
      plVar1 = (long *)(ppeVar3 + 5);
      ppeVar3 = (exec_node **)((long *)*plVar1 + -5);
      if (*(long *)*plVar1 == 0) {
        ppeVar3 = (exec_node **)0x0;
      }
    } while (ppeVar3 != (exec_node **)0x0);
  }
  if (this->new_scope != 0) {
    glsl_symbol_table::pop_scope(state->symbols);
  }
  return (ir_rvalue *)0x0;
}

Assistant:

ir_rvalue *
ast_compound_statement::hir(exec_list *instructions,
                            struct _mesa_glsl_parse_state *state)
{
   if (new_scope)
      state->symbols->push_scope();

   foreach_list_typed (ast_node, ast, link, &this->statements)
      ast->hir(instructions, state);

   if (new_scope)
      state->symbols->pop_scope();

   /* Compound statements do not have r-values.
    */
   return NULL;
}